

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_block_mapping_key(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  int *piVar1;
  yaml_emitter_state_t *pyVar2;
  int iVar3;
  int first_local;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  if ((first == 0) || (iVar3 = yaml_emitter_increase_indent(emitter,0,0), iVar3 != 0)) {
    if (event->type == YAML_MAPPING_END_EVENT) {
      piVar1 = (emitter->indents).top;
      (emitter->indents).top = piVar1 + -1;
      emitter->indent = piVar1[-1];
      pyVar2 = (emitter->states).top;
      (emitter->states).top = pyVar2 + -1;
      emitter->state = pyVar2[-1];
      emitter_local._4_4_ = 1;
    }
    else {
      iVar3 = yaml_emitter_write_indent(emitter);
      if (iVar3 == 0) {
        emitter_local._4_4_ = 0;
      }
      else {
        iVar3 = yaml_emitter_check_simple_key(emitter);
        if (iVar3 == 0) {
          iVar3 = yaml_emitter_write_indicator(emitter,"?",1,0,1);
          if (iVar3 == 0) {
            emitter_local._4_4_ = 0;
          }
          else if (((emitter->states).top == (emitter->states).end) &&
                  (iVar3 = yaml_stack_extend(&(emitter->states).start,&(emitter->states).top,
                                             &(emitter->states).end), iVar3 == 0)) {
            emitter->error = YAML_MEMORY_ERROR;
            emitter_local._4_4_ = 0;
          }
          else {
            pyVar2 = (emitter->states).top;
            (emitter->states).top = pyVar2 + 1;
            *pyVar2 = YAML_EMIT_BLOCK_MAPPING_VALUE_STATE;
            emitter_local._4_4_ = yaml_emitter_emit_node(emitter,event,0,0,1,0);
          }
        }
        else if (((emitter->states).top == (emitter->states).end) &&
                (iVar3 = yaml_stack_extend(&(emitter->states).start,&(emitter->states).top,
                                           &(emitter->states).end), iVar3 == 0)) {
          emitter->error = YAML_MEMORY_ERROR;
          emitter_local._4_4_ = 0;
        }
        else {
          pyVar2 = (emitter->states).top;
          (emitter->states).top = pyVar2 + 1;
          *pyVar2 = YAML_EMIT_BLOCK_MAPPING_SIMPLE_VALUE_STATE;
          emitter_local._4_4_ = yaml_emitter_emit_node(emitter,event,0,0,1,1);
        }
      }
    }
  }
  else {
    emitter_local._4_4_ = 0;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_block_mapping_key(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (first)
    {
        if (!yaml_emitter_increase_indent(emitter, 0, 0))
            return 0;
    }

    if (event->type == YAML_MAPPING_END_EVENT)
    {
        emitter->indent = POP(emitter, emitter->indents);
        emitter->state = POP(emitter, emitter->states);

        return 1;
    }

    if (!yaml_emitter_write_indent(emitter))
        return 0;

    if (yaml_emitter_check_simple_key(emitter))
    {
        if (!PUSH(emitter, emitter->states,
                    YAML_EMIT_BLOCK_MAPPING_SIMPLE_VALUE_STATE))
            return 0;

        return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 1);
    }
    else
    {
        if (!yaml_emitter_write_indicator(emitter, "?", 1, 0, 1))
            return 0;
        if (!PUSH(emitter, emitter->states,
                    YAML_EMIT_BLOCK_MAPPING_VALUE_STATE))
            return 0;

        return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 0);
    }
}